

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

void NULLC::ArrayCopy(NULLCAutoArray dst,NULLCAutoArray src)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  uint in_stack_00000008;
  void *in_stack_0000000c;
  uint in_stack_00000014;
  uint in_stack_00000018;
  void *in_stack_0000001c;
  uint in_stack_00000024;
  
  if (in_stack_0000000c != in_stack_0000001c) {
    if (in_stack_00000008 != in_stack_00000018) {
      pcVar2 = nullcGetTypeName(in_stack_00000008);
      pcVar3 = nullcGetTypeName(in_stack_00000018);
      nullcThrowError("ERROR: destination element type \'%s\' doesn\'t match source element type \'%s\'"
                      ,pcVar2,pcVar3);
      return;
    }
    if (in_stack_00000014 < in_stack_00000024) {
      nullcThrowError("ERROR: destination array size \'%d\' is smaller than source array size \'%d\'"
                      ,(ulong)in_stack_00000014,(ulong)in_stack_00000024);
      return;
    }
    if (in_stack_00000024 != 0) {
      uVar1 = nullcGetTypeSize(in_stack_00000008);
      memcpy(in_stack_0000000c,in_stack_0000001c,(ulong)(in_stack_00000024 * uVar1));
      return;
    }
  }
  return;
}

Assistant:

void NULLC::ArrayCopy(NULLCAutoArray dst, NULLCAutoArray src)
{
	if(dst.ptr == src.ptr)
		return;

	if(dst.typeID != src.typeID)
	{
		nullcThrowError("ERROR: destination element type '%s' doesn't match source element type '%s'", nullcGetTypeName(dst.typeID), nullcGetTypeName(src.typeID));
		return;
	}
	if(dst.len < src.len)
	{
		nullcThrowError("ERROR: destination array size '%d' is smaller than source array size '%d'", dst.len, src.len);
		return;
	}

	if(src.len == 0)
		return;

	memcpy(dst.ptr, src.ptr, unsigned(nullcGetTypeSize(dst.typeID) * src.len));
}